

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-left-rotation.cpp
# Opt level: O2

int main(void)

{
  istream *this;
  ostream *poVar1;
  int i_1;
  long lVar2;
  int i;
  long lVar3;
  allocator_type local_41;
  int length;
  int shift;
  vector<int,_std::allocator<int>_> xs;
  
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&length);
  std::istream::operator>>(this,&shift);
  std::vector<int,_std::allocator<int>_>::vector(&xs,(long)length,&local_41);
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < length; lVar3 = lVar3 + 1) {
    std::istream::operator>>
              ((istream *)&std::cin,
               (int *)((long)xs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + 4;
  }
  rotate(&xs,shift % length);
  for (lVar2 = 0; lVar2 < length; lVar2 = lVar2 + 1) {
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        xs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar2]);
    std::operator<<(poVar1,' ');
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&xs.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main() {
  int length, shift;
  std::cin >> length >> shift;
  std::vector<int> xs(length);
  for (int i = 0; i < length; ++i) {
    std::cin >> xs[i];
  }
  rotate(xs, shift % length);
  for (int i = 0; i < length; ++i) {
    std::cout << xs[i] << ' ';
  }
  std::cout << std::endl;
  return 0;
}